

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O2

PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> * __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
enqueue(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,
       SPElement *element)

{
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar1;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_current;
  LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_00;
  
  pLVar1 = (this->_list)._header;
  this_00 = &this->_list;
  if (pLVar1 != (this->_list)._tail) {
    pLVar1 = pLVar1->_next;
    if ((pLVar1->element).weight <= element->weight) {
      do {
        _current = pLVar1;
        pLVar1 = _current->_next;
        if (pLVar1 == (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0)
        {
          LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::insertToTail
                    (this_00,element);
          return this;
        }
      } while ((pLVar1->element).weight <= element->weight);
      LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::insertAfterNode
                (this_00,_current,element);
      return this;
    }
  }
  LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::insertToHeader
            (this_00,element);
  return this;
}

Assistant:

inline
    PriorityQueue<T>& PriorityQueue<T>::enqueue(const T &element) {
        if (isEmpty()) {
            _list.insertToHeader(element);
            return *this;
        }

        if (_less(element, _list.begin()->element)) {
            _list.insertToHeader(element);
            return *this;
        }

        for (auto node = _list.begin(); node->next() != _list.end(); node = node->next()) {
            if (_less(element, node->next()->element)) {
                _list.insertAfterNode(node, element);
                return *this;
            }
        }
        _list.insertToTail(element);
        return *this;
    }